

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_ERET(DisasContext_conflict1 *s,arg_ERET *a)

{
  TCGv_i32 pc;
  uint uVar1;
  
  uVar1 = (uint)s->features;
  if ((uVar1 >> 0xd & 1) != 0) {
    if (s->user == 0) {
      if (s->current_el == 2) {
        pc = load_cpu_offset(s->uc->tcg_ctx,0x248);
      }
      else {
        pc = load_reg(s,0xe);
      }
      gen_exception_return(s,pc);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return (_Bool)((byte)(uVar1 >> 0xd) & 1);
}

Assistant:

static bool trans_ERET(DisasContext *s, arg_ERET *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!arm_dc_feature(s, ARM_FEATURE_V7VE)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
        return true;
    }
    if (s->current_el == 2) {
        /* ERET from Hyp uses ELR_Hyp, not LR */
        tmp = load_cpu_field(tcg_ctx, elr_el[2]);
    } else {
        tmp = load_reg(s, 14);
    }
    gen_exception_return(s, tmp);
    return true;
}